

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void SHA1ProcessMessageBlock(SHA1Context *context)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint auStack_1b8 [7];
  undefined1 auStack_199 [21];
  uint auStack_184 [85];
  
  for (lVar8 = 0x21; lVar8 != 0x61; lVar8 = lVar8 + 4) {
    uVar9 = *(uint *)((long)context->Intermediate_Hash + lVar8 + -3);
    *(uint *)(auStack_199 + lVar8) =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  }
  for (lVar8 = 0x10; lVar8 != 0x50; lVar8 = lVar8 + 1) {
    uVar9 = *(uint *)(auStack_199 + lVar8 * 4 + 1) ^ auStack_184[lVar8] ^ auStack_1b8[lVar8 + 2] ^
            auStack_1b8[lVar8];
    auStack_184[lVar8 + 3] = uVar9 << 1 | (uint)((int)uVar9 < 0);
  }
  uVar1 = context->Intermediate_Hash[1];
  uVar2 = context->Intermediate_Hash[2];
  uVar9 = context->Intermediate_Hash[3];
  uVar3 = context->Intermediate_Hash[4];
  uVar13 = uVar3;
  uVar6 = context->Intermediate_Hash[0];
  uVar12 = uVar1;
  uVar7 = uVar2;
  uVar11 = uVar9;
  for (lVar8 = 0; uVar15 = uVar7, uVar16 = uVar6, lVar8 != 0x14; lVar8 = lVar8 + 1) {
    lVar5 = lVar8 + 3;
    iVar17 = (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar14 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar13 = uVar11;
    uVar6 = iVar17 + ((uVar15 ^ uVar11) & uVar12 ^ uVar11) + auStack_184[lVar5] + 0x5a827999;
    uVar12 = uVar16;
    uVar7 = uVar14 | uVar4;
    uVar11 = uVar15;
  }
  for (lVar8 = 0x14; uVar14 = uVar15, lVar8 != 0x28; lVar8 = lVar8 + 1) {
    lVar5 = lVar8 + 3;
    iVar17 = (uVar14 ^ uVar12 ^ uVar11) + (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar15 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar13 = uVar11;
    uVar12 = uVar16;
    uVar15 = uVar15 | uVar4;
    uVar16 = iVar17 + auStack_184[lVar5] + 0x6ed9eba1;
    uVar11 = uVar14;
  }
  for (lVar8 = 0x28; lVar8 != 0x3c; lVar8 = lVar8 + 1) {
    uVar10 = (uVar11 ^ uVar14) & uVar12;
    lVar5 = lVar8 + 3;
    iVar17 = (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar15 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar13 = uVar11;
    uVar12 = uVar16;
    uVar16 = iVar17 + (uVar11 & uVar14 ^ uVar10) + auStack_184[lVar5] + 0x8f1bbcdc;
    uVar11 = uVar14;
    uVar14 = uVar15 | uVar4;
  }
  lVar8 = 0x3c;
  while( true ) {
    if (lVar8 == 0x50) break;
    lVar5 = lVar8 + 3;
    iVar17 = (uVar14 ^ uVar12 ^ uVar11) + (uVar16 << 5 | uVar16 >> 0x1b) + uVar13;
    uVar15 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    lVar8 = lVar8 + 1;
    uVar13 = uVar11;
    uVar12 = uVar16;
    uVar16 = iVar17 + auStack_184[lVar5] + 0xca62c1d6;
    uVar11 = uVar14;
    uVar14 = uVar15 | uVar4;
  }
  context->Intermediate_Hash[0] = uVar16 + context->Intermediate_Hash[0];
  context->Intermediate_Hash[1] = uVar12 + uVar1;
  context->Intermediate_Hash[2] = uVar14 + uVar2;
  context->Intermediate_Hash[3] = uVar11 + uVar9;
  context->Intermediate_Hash[4] = uVar13 + uVar3;
  context->Message_Block_Index = 0;
  return;
}

Assistant:

static void SHA1ProcessMessageBlock(SHA1Context *context)
{
    /* Constants defined in FIPS-180-2, section 4.2.1 */
    const uint32_t K[4] = {
        0x5A827999, 0x6ED9EBA1, 0x8F1BBCDC, 0xCA62C1D6
    };
    int        t;               /* Loop counter */
    uint32_t   temp;            /* Temporary word value */
    uint32_t   W[80];           /* Word sequence */
    uint32_t   A, B, C, D, E;   /* Word buffers */

    /*
    * Initialize the first 16 words in the array W
    */
    for (t = 0; t < 16; t++) {
        W[t] = ((uint32_t)context->Message_Block[t * 4]) << 24;
        W[t] |= ((uint32_t)context->Message_Block[t * 4 + 1]) << 16;
        W[t] |= ((uint32_t)context->Message_Block[t * 4 + 2]) << 8;
        W[t] |= ((uint32_t)context->Message_Block[t * 4 + 3]);
    }

    for (t = 16; t < 80; t++)
        W[t] = SHA1_ROTL(1, W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16]);

    A = context->Intermediate_Hash[0];
    B = context->Intermediate_Hash[1];
    C = context->Intermediate_Hash[2];
    D = context->Intermediate_Hash[3];
    E = context->Intermediate_Hash[4];

    for (t = 0; t < 20; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Ch(B, C, D) + E + W[t] + K[0];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    for (t = 20; t < 40; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Parity(B, C, D) + E + W[t] + K[1];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    for (t = 40; t < 60; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Maj(B, C, D) + E + W[t] + K[2];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    for (t = 60; t < 80; t++) {
        temp = SHA1_ROTL(5, A) + SHA_Parity(B, C, D) + E + W[t] + K[3];
        E = D;
        D = C;
        C = SHA1_ROTL(30, B);
        B = A;
        A = temp;
    }

    context->Intermediate_Hash[0] += A;
    context->Intermediate_Hash[1] += B;
    context->Intermediate_Hash[2] += C;

    context->Intermediate_Hash[3] += D;
    context->Intermediate_Hash[4] += E;

    context->Message_Block_Index = 0;
}